

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

void Gia_ObjTerSimCo(Gia_Obj_t *pObj)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj_local;
  
  iVar1 = Gia_ObjIsCo(pObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsCo(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x349,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
  }
  pObj_00 = Gia_ObjFanin0(pObj);
  iVar1 = Gia_ObjTerSimGetC(pObj_00);
  if (iVar1 != 0) {
    __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x34a,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
  }
  iVar1 = Gia_ObjTerSimGet0Fanin0(pObj);
  if (iVar1 == 0) {
    iVar1 = Gia_ObjTerSimGet1Fanin0(pObj);
    if (iVar1 == 0) {
      Gia_ObjTerSimSetX(pObj);
    }
    else {
      Gia_ObjTerSimSet1(pObj);
    }
  }
  else {
    Gia_ObjTerSimSet0(pObj);
  }
  return;
}

Assistant:

static inline void Gia_ObjTerSimCo( Gia_Obj_t * pObj )
{
    assert( Gia_ObjIsCo(pObj) );
    assert( !Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) ) );
    if ( Gia_ObjTerSimGet0Fanin0(pObj) )
        Gia_ObjTerSimSet0( pObj );
    else if ( Gia_ObjTerSimGet1Fanin0(pObj) )
        Gia_ObjTerSimSet1( pObj );
    else 
        Gia_ObjTerSimSetX( pObj );
}